

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeEnumConstants
               (ExpressionContext *ctx,TypeBase *type,IntrusiveList<SynConstant> constants,
               IntrusiveList<ConstantData> *target)

{
  ModuleData *pMVar1;
  SynIdentifier *pSVar2;
  bool bVar3;
  int iVar4;
  ExprBase *pEVar5;
  ExprBase *pEVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConstantData *pCVar7;
  ExprBase *pEVar8;
  TypeBase *pTVar9;
  ExpressionContext *ctx_00;
  _func_int **pp_Var10;
  IntrusiveList<ConstantData> *pIVar11;
  InplaceStr name;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  ctx_00 = (ExpressionContext *)constants.head;
  pEVar6 = (ExprBase *)0x0;
  pEVar8 = (ExprBase *)target;
  do {
    if (ctx_00 == (ExpressionContext *)0x0) {
      return;
    }
    pMVar1 = (ctx_00->uniqueDependencies).little[3];
    pIVar11 = target;
    if (pMVar1 == (ModuleData *)0x0) {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
      pTVar9 = ctx->typeInt;
      if (pEVar6 == (ExprBase *)0x0) {
LAB_00161366:
        pp_Var10 = (_func_int **)0x0;
      }
      else {
        pp_Var10 = (_func_int **)((long)pEVar6[1]._vptr_ExprBase + 1);
      }
      pEVar5->typeID = 6;
      pEVar5->source = (SynBase *)ctx_00;
      pEVar5->type = pTVar9;
      pEVar5->next = (ExprBase *)0x0;
      pEVar5->listed = false;
      pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
      pEVar5[1]._vptr_ExprBase = pp_Var10;
      pEVar6 = pEVar5;
LAB_00161396:
      while( true ) {
        pCVar7 = pIVar11->head;
        pMVar1 = (ctx_00->uniqueDependencies).little[2];
        if (pCVar7 == (ConstantData *)0x0) break;
        bVar3 = InplaceStr::operator==
                          ((InplaceStr *)&pMVar1->importedFunctionCount,&pCVar7->name->name);
        if (bVar3) {
          pEVar8 = (ExprBase *)(pCVar7->name->name).begin;
          anon_unknown.dwarf_94284::Report
                    (ctx,(SynBase *)ctx_00,"ERROR: name \'%.*s\' is already taken",
                     (ulong)(uint)(*(int *)&(pCVar7->name->name).end - (int)pEVar8));
        }
        pIVar11 = (IntrusiveList<ConstantData> *)&pCVar7->next;
      }
      name.end = (char *)pEVar8;
      name.begin = (char *)pMVar1[1].source;
      anon_unknown.dwarf_94284::CheckVariableConflict
                ((anon_unknown_dwarf_94284 *)ctx,ctx_00,*(SynBase **)&pMVar1->importedFunctionCount,
                 name);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pCVar7 = (ConstantData *)CONCAT44(extraout_var_01,iVar4);
      pSVar2 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[2];
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_02,iVar4);
      pp_Var10 = pEVar6[1]._vptr_ExprBase;
      pEVar8->typeID = 6;
      pEVar8->source = (SynBase *)ctx_00;
      pEVar8->type = type;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
      pEVar8[1]._vptr_ExprBase = pp_Var10;
      pCVar7->name = pSVar2;
      pCVar7->value = pEVar8;
      pCVar7->next = (ConstantData *)0x0;
      pCVar7->listed = false;
      pEVar8 = pEVar6;
      IntrusiveList<ConstantData>::push_back(target,pCVar7);
    }
    else {
      pEVar5 = AnalyzeExpression(ctx,(SynBase *)pMVar1);
      pTVar9 = pEVar5->type;
      if ((pTVar9 == (TypeBase *)0x0) || (pTVar9->typeID != 0)) {
        if (pTVar9 != type) {
          pEVar8 = (ExprBase *)0x0;
          pEVar5 = CreateCast(ctx,(SynBase *)ctx_00,pEVar5,ctx->typeInt,false);
        }
        pEVar6 = anon_unknown.dwarf_94284::EvaluateExpression(ctx,(SynBase *)ctx_00,pEVar5);
        if ((pEVar6 == (ExprBase *)0x0) || (pEVar6->typeID != 6)) {
          anon_unknown.dwarf_94284::Report
                    (ctx,(SynBase *)ctx_00,"ERROR: expression didn\'t evaluate to a constant number"
                    );
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
          pTVar9 = ctx->typeInt;
          goto LAB_00161366;
        }
        goto LAB_00161396;
      }
    }
    ctx_00 = (ExpressionContext *)(ctx_00->uniqueDependencies).little[0];
    if ((ctx_00 == (ExpressionContext *)0x0) ||
       (*(int *)&((InplaceStr *)&ctx_00->code)->begin != 0x3a)) {
      ctx_00 = (ExpressionContext *)0x0;
    }
  } while( true );
}

Assistant:

void AnalyzeEnumConstants(ExpressionContext &ctx, TypeBase *type, IntrusiveList<SynConstant> constants, IntrusiveList<ConstantData> &target)
{
	ExprIntegerLiteral *last = NULL;

	for(SynConstant *constant = constants.head; constant; constant = getType<SynConstant>(constant->next))
	{
		ExprIntegerLiteral *value = NULL;
			
		if(constant->value)
		{
			ExprBase *rhs = AnalyzeExpression(ctx, constant->value);

			if(isType<TypeError>(rhs->type))
				continue;

			if(rhs->type == type)
				value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, constant, rhs));
			else
				value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, constant, CreateCast(ctx, constant, rhs, ctx.typeInt, false)));
		}
		else if(last)
		{
			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, last->value + 1);
		}
		else
		{
			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		if(!value)
		{
			Report(ctx, constant, "ERROR: expression didn't evaluate to a constant number");

			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		last = value;

		for(ConstantData *curr = target.head; curr; curr = curr->next)
		{
			if(constant->name->name == curr->name->name)
				Report(ctx, constant, "ERROR: name '%.*s' is already taken", FMT_ISTR(curr->name->name));
		}

		CheckVariableConflict(ctx, constant, constant->name->name);

		target.push_back(new (ctx.get<ConstantData>()) ConstantData(constant->name, new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, type, value->value)));
	}
}